

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterLoadRowid(Fts5Index *p,Fts5SegIter *pIter)

{
  byte bVar1;
  int local_24;
  u8 *puStack_20;
  int iOff;
  u8 *a;
  Fts5SegIter *pIter_local;
  Fts5Index *p_local;
  
  puStack_20 = pIter->pLeaf->p;
  local_24 = pIter->iLeafOffset;
  if (pIter->pLeaf->szLeaf <= local_24) {
    fts5SegIterNextPage(p,pIter);
    if (pIter->pLeaf == (Fts5Data *)0x0) {
      if (p->rc != 0) {
        return;
      }
      p->rc = 0x10b;
      return;
    }
    local_24 = 4;
    puStack_20 = pIter->pLeaf->p;
  }
  bVar1 = sqlite3Fts5GetVarint(puStack_20 + local_24,(u64 *)&pIter->iRowid);
  pIter->iLeafOffset = (uint)bVar1 + local_24;
  return;
}

Assistant:

static void fts5SegIterLoadRowid(Fts5Index *p, Fts5SegIter *pIter){
  u8 *a = pIter->pLeaf->p;        /* Buffer to read data from */
  int iOff = pIter->iLeafOffset;

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  if( iOff>=pIter->pLeaf->szLeaf ){
    fts5SegIterNextPage(p, pIter);
    if( pIter->pLeaf==0 ){
      if( p->rc==SQLITE_OK ) p->rc = FTS5_CORRUPT;
      return;
    }
    iOff = 4;
    a = pIter->pLeaf->p;
  }
  iOff += sqlite3Fts5GetVarint(&a[iOff], (u64*)&pIter->iRowid);
  pIter->iLeafOffset = iOff;
}